

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flux_test.cpp
# Opt level: O2

void flux_test::comparisonTest(void)

{
  SystemImpl *this;
  SystemImpl *this_00;
  FlowExp *pFVar1;
  
  this = (SystemImpl *)operator_new(0x30);
  SystemImpl::SystemImpl(this);
  this_00 = (SystemImpl *)operator_new(0x30);
  SystemImpl::SystemImpl(this_00);
  pFVar1 = (FlowExp *)operator_new(0x38);
  FlowExp::FlowExp(pFVar1,(System *)this,(System *)this_00);
  pFVar1 = (FlowExp *)operator_new(0x38);
  FlowExp::FlowExp(pFVar1,(System *)this,(System *)this_00);
  return;
}

Assistant:

void flux_test::comparisonTest() {
    auto *s1 = new SystemImpl();
    auto *s2 = new SystemImpl();
    auto *flux1 = new FlowExp(s1, s2);
    auto *flux2 = new FlowExp(s1, s2);

//    assert(flux1 == flux2);
}